

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

Status * google::protobuf::util::converter::ProtoStreamObjectWriter::RenderFieldMask
                   (Status *__return_storage_ptr__,ProtoStreamObjectWriter *ow,DataPiece *data)

{
  stringpiece_ssize_type sVar1;
  PathSinkCallback *in_R8;
  StringPiece SVar2;
  StringPiece paths;
  StringPiece error_message;
  AlphaNum local_f8;
  _Bind<google::protobuf::util::Status_(*(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::_Placeholder<1>))(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_google::protobuf::StringPiece)>
  local_c8 [3];
  StringPiece local_98;
  string local_88;
  _Function_base local_68;
  string local_48;
  
  if (data->type_ == TYPE_STRING) {
    SVar2 = DataPiece::str(data);
    paths.ptr_ = (char *)SVar2.length_;
    local_c8[0]._M_f = RenderOneFieldPath;
    local_c8[0]._M_bound_args.
    super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::_Placeholder<1>_>
                    )(_Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::_Placeholder<1>_>
                      )ow;
    std::function<google::protobuf::util::Status(google::protobuf::StringPiece)>::
    function<std::_Bind<google::protobuf::util::Status(*(google::protobuf::util::converter::ProtoStreamObjectWriter*,std::_Placeholder<1>))(google::protobuf::util::converter::ProtoStreamObjectWriter*,google::protobuf::StringPiece)>,void>
              ((function<google::protobuf::util::Status(google::protobuf::StringPiece)> *)&local_68,
               local_c8);
    paths.length_ = (stringpiece_ssize_type)&local_68;
    DecodeCompactFieldMaskPaths(__return_storage_ptr__,(converter *)SVar2.ptr_,paths,in_R8);
    std::_Function_base::~_Function_base(&local_68);
  }
  else if (data->type_ == TYPE_NULL) {
    Status::Status(__return_storage_ptr__);
  }
  else {
    local_c8[0]._M_f = (_func_Status_ProtoStreamObjectWriter_ptr_StringPiece *)0x36e380;
    local_c8[0]._M_bound_args.
    super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::_Placeholder<1>_>
                    )(_Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
                      )0x2b;
    StringPiece::StringPiece(&local_98,"");
    SVar2.length_ = local_98.length_;
    SVar2.ptr_ = local_98.ptr_;
    DataPiece::ValueAsStringOrDefault_abi_cxx11_(&local_88,data,SVar2);
    local_f8.piece_data_ = local_88._M_dataplus._M_p;
    local_f8.piece_size_ = local_88._M_string_length;
    StrCat_abi_cxx11_(&local_48,(protobuf *)local_c8,&local_f8,(AlphaNum *)local_98.length_);
    sVar1 = StringPiece::CheckedSsizeTFromSizeT(local_48._M_string_length);
    error_message.length_ = sVar1;
    error_message.ptr_ = local_48._M_dataplus._M_p;
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,error_message);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectWriter::RenderFieldMask(ProtoStreamObjectWriter* ow,
                                                const DataPiece& data) {
  if (data.type() == DataPiece::TYPE_NULL) return Status();
  if (data.type() != DataPiece::TYPE_STRING) {
    return Status(util::error::INVALID_ARGUMENT,
                  StrCat("Invalid data type for field mask, value is ",
                               data.ValueAsStringOrDefault("")));
  }

  // TODO(tsun): figure out how to do proto descriptor based snake case
  // conversions as much as possible. Because ToSnakeCase sometimes returns the
  // wrong value.
  return DecodeCompactFieldMaskPaths(data.str(),
                                     std::bind(&RenderOneFieldPath, ow, _1));
}